

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O1

bool __thiscall TxReconciliationTracker::Impl::IsPeerRegistered(Impl *this,NodeId peer_id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  long in_FS_OFFSET;
  bool bVar6;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock14;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  uVar1 = (this->m_states)._M_h._M_bucket_count;
  uVar3 = (ulong)peer_id % uVar1;
  p_Var4 = (this->m_states)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     p_Var4->_M_nxt[1]._M_nxt != (_Hash_node_base *)peer_id)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, p_Var2[1]._M_nxt == (_Hash_node_base *)peer_id)) goto LAB_009923bc;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_009923bc:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = *(char *)&p_Var2[5]._M_nxt == '\x01';
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);
        return (recon_state != m_states.end() &&
                std::holds_alternative<TxReconciliationState>(recon_state->second));
    }